

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::OP_SetOutAsmInt
          (InterpreterStackFrame *this,RegSlot outRegisterID,int val)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (*(ulong *)(this + 0x30) <= (ulong)outRegisterID * 8 + *(long *)(this + 0x28)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x94c,"(m_outParams + outRegisterID < m_outSp)",
                                "m_outParams + outRegisterID < m_outSp");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  *(ulong *)(*(long *)(this + 0x28) + (ulong)outRegisterID * 8) = (ulong)(uint)val | 0x1000000000000
  ;
  return;
}

Assistant:

inline void InterpreterStackFrame::OP_SetOutAsmInt(RegSlot outRegisterID, int val)
    {
        Assert(m_outParams + outRegisterID < m_outSp);
        m_outParams[outRegisterID] = JavascriptNumber::ToVar(val, scriptContext);
    }